

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

gguf_context * gguf_init_empty(void)

{
  gguf_context *pgVar1;
  gguf_context *unaff_retaddr;
  
  pgVar1 = (gguf_context *)operator_new(0x58);
  gguf_context::gguf_context(unaff_retaddr);
  return pgVar1;
}

Assistant:

struct gguf_context * gguf_init_empty(void) {
    return new gguf_context;
}